

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexData(MeshGeometry *this,string *type,int index,Scope *source)

{
  pointer piVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  Element *pEVar5;
  Token *pTVar6;
  Token *t;
  Token *t_00;
  Token *t_01;
  long lVar7;
  undefined1 auVar8 [8];
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [8];
  uint *puStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  std::__cxx11::string::string((string *)local_1a8,"MappingInformationType",(allocator *)&local_1e8)
  ;
  pEVar5 = GetRequiredElement(source,(string *)local_1a8,(Element *)0x0);
  pTVar6 = GetRequiredToken(pEVar5,0);
  ParseTokenAsString_abi_cxx11_(&local_1c8,(FBX *)pTVar6,t);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string((string *)local_1a8,"ReferenceInformationType",&local_1e9);
  pEVar5 = GetRequiredElement(source,(string *)local_1a8,(Element *)0x0);
  pTVar6 = GetRequiredToken(pEVar5,0);
  ParseTokenAsString_abi_cxx11_(&local_1e8,(FBX *)pTVar6,t_00);
  std::__cxx11::string::~string((string *)local_1a8);
  bVar4 = std::operator==(type,"LayerElementUV");
  if (bVar4) {
    if (index < 8) {
      std::__cxx11::string::string((string *)local_1a8,"Name",&local_1e9);
      pEVar5 = Scope::operator[](source,(string *)local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::assign((char *)(this->m_uvNames + index));
      if (pEVar5 != (Element *)0x0) {
        pTVar6 = GetRequiredToken(pEVar5,0);
        ParseTokenAsString_abi_cxx11_((string *)local_1a8,(FBX *)pTVar6,t_01);
        std::__cxx11::string::operator=((string *)(this->m_uvNames + index),(string *)local_1a8);
        std::__cxx11::string::~string((string *)local_1a8);
      }
      ReadVertexDataUV(this,this->m_uvs + index,source,&local_1c8,&local_1e8);
      goto LAB_00171c0a;
    }
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[60]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [60])"ignoring UV layer, maximum number of UV channels exceeded: ");
    std::ostream::operator<<(local_1a8,index);
    std::operator<<((ostream *)local_1a8," (limit is ");
    std::ostream::operator<<(local_1a8,8);
    std::operator<<((ostream *)local_1a8,")");
    LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
LAB_001718e2:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  else {
    bVar4 = std::operator==(type,"LayerElementMaterial");
    if (bVar4) {
      if ((this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_1a8 = (undefined1  [8])0x0;
        puStack_1a0 = (uint *)0x0;
        local_198[0]._M_allocated_capacity = (pointer)0x0;
        ReadVertexDataMaterials
                  (this,(vector<int,_std::allocator<int>_> *)local_1a8,source,&local_1c8,&local_1e8)
        ;
        lVar7 = 0;
        for (auVar8 = local_1a8; auVar8 != (undefined1  [8])puStack_1a0;
            auVar8 = (undefined1  [8])((long)auVar8 + 4)) {
          lVar7 = lVar7 + (ulong)(*(uint *)auVar8 >> 0x1f);
        }
        if (lVar7 == (long)puStack_1a0 - (long)local_1a8 >> 2) {
          LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x171a9f);
        }
        else {
          puVar2 = (uint *)(this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start;
          puVar3 = (uint *)(this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_finish;
          piVar1 = (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1a8;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)puStack_1a0;
          (this->m_materials).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_198[0]._0_8_;
          local_1a8 = (undefined1  [8])puVar2;
          puStack_1a0 = puVar3;
          local_198[0]._0_8_ = piVar1;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)local_1a8);
        goto LAB_00171c0a;
      }
    }
    else {
      bVar4 = std::operator==(type,"LayerElementNormal");
      if (bVar4) {
        if ((this->m_normals).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (this->m_normals).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ReadVertexDataNormals(this,&this->m_normals,source,&local_1c8,&local_1e8);
          goto LAB_00171c0a;
        }
      }
      else {
        bVar4 = std::operator==(type,"LayerElementTangent");
        if (bVar4) {
          if ((this->m_tangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (this->m_tangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ReadVertexDataTangents(this,&this->m_tangents,source,&local_1c8,&local_1e8);
            goto LAB_00171c0a;
          }
        }
        else {
          bVar4 = std::operator==(type,"LayerElementBinormal");
          if (!bVar4) {
            bVar4 = std::operator==(type,"LayerElementColor");
            if (!bVar4) goto LAB_00171c0a;
            if (index < 8) {
              ReadVertexDataColors(this,this->m_colors + index,source,&local_1c8,&local_1e8);
              goto LAB_00171c0a;
            }
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[69]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,
                       (char (*) [69])
                       "ignoring vertex color layer, maximum number of color sets exceeded: ");
            std::ostream::operator<<(local_1a8,index);
            std::operator<<((ostream *)local_1a8," (limit is ");
            std::ostream::operator<<(local_1a8,8);
            std::operator<<((ostream *)local_1a8,")");
            LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
            goto LAB_001718e2;
          }
          if ((this->m_binormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (this->m_binormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ReadVertexDataBinormals(this,&this->m_binormals,source,&local_1c8,&local_1e8);
            goto LAB_00171c0a;
          }
        }
      }
    }
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x171ad4);
  }
LAB_00171c0a:
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

void MeshGeometry::ReadVertexData(const std::string& type, int index, const Scope& source)
{
    const std::string& MappingInformationType = ParseTokenAsString(GetRequiredToken(
        GetRequiredElement(source,"MappingInformationType"),0)
    );

    const std::string& ReferenceInformationType = ParseTokenAsString(GetRequiredToken(
        GetRequiredElement(source,"ReferenceInformationType"),0)
    );

    if (type == "LayerElementUV") {
        if(index >= AI_MAX_NUMBER_OF_TEXTURECOORDS) {
            FBXImporter::LogError(Formatter::format("ignoring UV layer, maximum number of UV channels exceeded: ")
                << index << " (limit is " << AI_MAX_NUMBER_OF_TEXTURECOORDS << ")" );
            return;
        }

        const Element* Name = source["Name"];
        m_uvNames[index] = "";
        if(Name) {
            m_uvNames[index] = ParseTokenAsString(GetRequiredToken(*Name,0));
        }

        ReadVertexDataUV(m_uvs[index],source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementMaterial") {
        if (m_materials.size() > 0) {
            FBXImporter::LogError("ignoring additional material layer");
            return;
        }

        std::vector<int> temp_materials;

        ReadVertexDataMaterials(temp_materials,source,
            MappingInformationType,
            ReferenceInformationType
        );

        // sometimes, there will be only negative entries. Drop the material
        // layer in such a case (I guess it means a default material should
        // be used). This is what the converter would do anyway, and it
        // avoids losing the material if there are more material layers
        // coming of which at least one contains actual data (did observe
        // that with one test file).
        const size_t count_neg = std::count_if(temp_materials.begin(),temp_materials.end(),[](int n) { return n < 0; });
        if(count_neg == temp_materials.size()) {
            FBXImporter::LogWarn("ignoring dummy material layer (all entries -1)");
            return;
        }

        std::swap(temp_materials, m_materials);
    }
    else if (type == "LayerElementNormal") {
        if (m_normals.size() > 0) {
            FBXImporter::LogError("ignoring additional normal layer");
            return;
        }

        ReadVertexDataNormals(m_normals,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementTangent") {
        if (m_tangents.size() > 0) {
            FBXImporter::LogError("ignoring additional tangent layer");
            return;
        }

        ReadVertexDataTangents(m_tangents,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementBinormal") {
        if (m_binormals.size() > 0) {
            FBXImporter::LogError("ignoring additional binormal layer");
            return;
        }

        ReadVertexDataBinormals(m_binormals,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementColor") {
        if(index >= AI_MAX_NUMBER_OF_COLOR_SETS) {
            FBXImporter::LogError(Formatter::format("ignoring vertex color layer, maximum number of color sets exceeded: ")
                << index << " (limit is " << AI_MAX_NUMBER_OF_COLOR_SETS << ")" );
            return;
        }

        ReadVertexDataColors(m_colors[index],source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
}